

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::LineExitDiamondGenerator::rasterize
          (LineExitDiamondGenerator *this,LineExitDiamond *lineDiamonds,int maxDiamonds,
          int *numWritten)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  Vector<long,_2> res;
  Vector<long,_2> local_68;
  SubpixelLineSegment local_58;
  
  uVar1 = *(undefined8 *)(this->m_v0).m_data;
  fVar8 = (float)uVar1;
  fVar9 = (float)((ulong)uVar1 >> 0x20);
  uVar6 = -(uint)(fVar8 < 0.0);
  uVar7 = -(uint)(fVar9 < 0.0);
  local_58.m_v0.m_data[0] =
       (long)(fVar8 * 256.0 + (float)(~uVar6 & 0x3f000000 | uVar6 & 0xbf000000));
  local_58.m_v0.m_data[1] =
       (long)(fVar9 * 256.0 + (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000));
  uVar1 = *(undefined8 *)(this->m_v1).m_data;
  fVar8 = (float)uVar1;
  fVar9 = (float)((ulong)uVar1 >> 0x20);
  uVar6 = -(uint)(fVar8 < 0.0);
  uVar7 = -(uint)(fVar9 < 0.0);
  local_58.m_v1.m_data[0] =
       (long)(fVar8 * 256.0 + (float)(~uVar6 & 0x3f000000 | uVar6 & 0xbf000000));
  local_58.m_v1.m_data[1] =
       (long)(fVar9 * 256.0 + (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000));
  iVar5 = (this->m_curPos).m_data[1];
  iVar3 = 0;
  if (0 < maxDiamonds && iVar5 <= (this->m_bboxMax).m_data[1]) {
    iVar4 = (this->m_curPos).m_data[0];
    iVar3 = 0;
    do {
      local_68.m_data[0] = (long)(int)(iVar4 << 8 | 0x80);
      local_68.m_data[1] = (long)(int)(iVar5 << 8 | 0x80);
      bVar2 = LineRasterUtil::doesLineSegmentExitDiamond(&local_58,&local_68);
      if (bVar2) {
        *(undefined8 *)lineDiamonds[iVar3].position.m_data = *(undefined8 *)(this->m_curPos).m_data;
        iVar3 = iVar3 + 1;
        iVar4 = (this->m_curPos).m_data[0];
        iVar5 = (this->m_curPos).m_data[1];
      }
      iVar4 = iVar4 + 1;
      (this->m_curPos).m_data[0] = iVar4;
      if ((this->m_bboxMax).m_data[0] < iVar4) {
        iVar5 = iVar5 + 1;
        (this->m_curPos).m_data[1] = iVar5;
        iVar4 = (this->m_bboxMin).m_data[0];
        (this->m_curPos).m_data[0] = iVar4;
      }
    } while ((iVar5 <= (this->m_bboxMax).m_data[1]) && (iVar3 < maxDiamonds));
  }
  *numWritten = iVar3;
  return;
}

Assistant:

void LineExitDiamondGenerator::rasterize (LineExitDiamond* const lineDiamonds, const int maxDiamonds, int& numWritten)
{
	DE_ASSERT(maxDiamonds > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy());
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy());
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											diamondNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && diamondNdx < maxDiamonds)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			LineExitDiamond& packet = lineDiamonds[diamondNdx];
			packet.position = m_curPos;
			++diamondNdx;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(diamondNdx <= maxDiamonds);
	numWritten = diamondNdx;
}